

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

uint32_t float128_to_uint32_m68k(float128 a,float_status *status)

{
  int val;
  uint64_t uVar1;
  int old_exc_flags;
  uint32_t res;
  uint64_t v;
  float_status *status_local;
  float128 a_local;
  
  val = get_float_exception_flags(status);
  uVar1 = float128_to_uint64_m68k(a,status);
  if (uVar1 < 0x100000000) {
    a_local.high._4_4_ = (uint32_t)uVar1;
  }
  else {
    set_float_exception_flags(val,status);
    float_raise_m68k('\x01',status);
    a_local.high._4_4_ = 0xffffffff;
  }
  return a_local.high._4_4_;
}

Assistant:

uint32_t float128_to_uint32(float128 a, float_status *status)
{
    uint64_t v;
    uint32_t res;
    int old_exc_flags = get_float_exception_flags(status);

    v = float128_to_uint64(a, status);
    if (v > 0xffffffff) {
        res = 0xffffffff;
    } else {
        return v;
    }
    set_float_exception_flags(old_exc_flags, status);
    float_raise(float_flag_invalid, status);
    return res;
}